

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

bool __thiscall QDesktopUnixServices::openUrl(QDesktopUnixServices *this,QUrl *url)

{
  byte bVar1;
  QUrl *in_RSI;
  anon_class_8_1_8991fb9c_for_openUrlInternal *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  anon_class_8_1_8991fb9c_for_openUrlInternal openUrlInternal;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff78;
  bool local_51;
  QUrl in_stack_ffffffffffffffd0;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::platformName();
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffff78,
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  bVar1 = QString::startsWith((QLatin1String *)local_28,(CaseSensitivity)QVar2.m_size);
  QString::~QString((QString *)0xac830e);
  if ((bVar1 & 1) == 0) {
    QString::QString((QString *)0xac8367);
    local_51 = QtPrivate::detail::
               StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:508:17),_void>
               ::anon_class_16_2_17300a76_for_o::anon_class_8_1_8991fb9c_for_openUrlInternal::
               operator()(in_RDI,in_RSI,(QString *)QVar2.m_data);
    QString::~QString((QString *)0xac838e);
  }
  else {
    QUrl::QUrl((QUrl *)&stack0xffffffffffffffd0,(QUrl *)in_RSI);
    runWithXdgActivationToken<QDesktopUnixServices::openUrl(QUrl_const&)::__0>
              ((anon_class_16_2_17300a76_for_o *)in_stack_ffffffffffffffd0.d);
    openUrl(QUrl_const&)::$_0::~__0((anon_class_16_2_17300a76_for_o *)0xac834c);
    local_51 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

bool QDesktopUnixServices::openUrl(const QUrl &url)
{
    auto openUrlInternal = [this](const QUrl &url, const QString &xdgActivationToken) {
        if (url.scheme() == "mailto"_L1) {
#  if QT_CONFIG(dbus)
            if (checkNeedPortalSupport()) {
                const QString parentWindow = QGuiApplication::focusWindow()
                        ? portalWindowIdentifier(QGuiApplication::focusWindow())
                        : QString();
                QDBusError error = xdgDesktopPortalSendEmail(url, parentWindow, xdgActivationToken);
                if (!error.isValid())
                    return true;

                // service not running, fall back
            }
#  endif
            return openDocument(url);
        }

#  if QT_CONFIG(dbus)
        if (checkNeedPortalSupport()) {
            const QString parentWindow = QGuiApplication::focusWindow()
                    ? portalWindowIdentifier(QGuiApplication::focusWindow())
                    : QString();
            QDBusError error = xdgDesktopPortalOpenUrl(url, parentWindow, xdgActivationToken);
            if (!error.isValid())
                return true;
        }
#  endif

        if (m_webBrowser.isEmpty()
            && !detectWebBrowser(desktopEnvironment(), true, &m_webBrowser)) {
            qCWarning(lcQpaServices, "Unable to detect a web browser to launch '%s'", qPrintable(url.toString()));
            return false;
        }
        return launch(m_webBrowser, url, xdgActivationToken);
    };

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        runWithXdgActivationToken(
                [openUrlInternal, url](const QString &token) { openUrlInternal(url, token); });

        return true;

    } else {
        return openUrlInternal(url, QString());
    }
}